

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

bool __thiscall
caffe::LayerParameter::MergePartialFromCodedStream(LayerParameter *this,CodedInputStream *input)

{
  InternalMetadataWithArena *this_00;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_02;
  byte *pbVar1;
  uint32 *puVar2;
  byte bVar3;
  byte *pbVar4;
  void *pvVar5;
  Rep *pRVar6;
  uint8 *puVar7;
  Arena *pAVar8;
  uint uVar9;
  bool bVar10;
  short extraout_AX;
  short extraout_AX_00;
  short sVar11;
  uint32 uVar12;
  TransformationParameter *pTVar13;
  InputParameter *pIVar14;
  EmbedParameter *pEVar15;
  FlattenParameter *pFVar16;
  ReductionParameter *pRVar17;
  TanHParameter *pTVar18;
  LogParameter *pLVar19;
  InfogainLossParameter *pIVar20;
  CropParameter *pCVar21;
  HingeLossParameter *pHVar22;
  ReshapeParameter *pRVar23;
  ExpParameter *pEVar24;
  ConcatParameter *pCVar25;
  ELUParameter *pEVar26;
  Type *this_03;
  HDF5DataParameter *pHVar27;
  DummyDataParameter *pDVar28;
  SoftmaxParameter *pSVar29;
  SigmoidParameter *pSVar30;
  AccuracyParameter *pAVar31;
  ImageDataParameter *pIVar32;
  Type *this_04;
  ArgMaxParameter *pAVar33;
  DataParameter *pDVar34;
  LossParameter *pLVar35;
  PReLUParameter *pPVar36;
  InnerProductParameter *pIVar37;
  BiasParameter *pBVar38;
  MVNParameter *pMVar39;
  ContrastiveLossParameter *pCVar40;
  PoolingParameter *pPVar41;
  HDF5OutputParameter *pHVar42;
  ConvolutionParameter *pCVar43;
  LRNParameter *pLVar44;
  EltwiseParameter *pEVar45;
  DropoutParameter *pDVar46;
  Type *this_05;
  PythonParameter *pPVar47;
  SPPParameter *pSVar48;
  ParameterParameter *pPVar49;
  PowerParameter *pPVar50;
  BatchNormParameter *pBVar51;
  MemoryDataParameter *pMVar52;
  ScaleParameter *pSVar53;
  ReLUParameter *pRVar54;
  ThresholdParameter *pTVar55;
  WindowDataParameter *pWVar56;
  TileParameter *pTVar57;
  SliceParameter *pSVar58;
  RecurrentParameter *pRVar59;
  pair<int,_int> pVar60;
  string *psVar61;
  Type *pTVar62;
  char *field_name;
  UnknownFieldSet *pUVar63;
  int iVar64;
  int iVar65;
  RepeatedPtrFieldBase *this_06;
  pointer data;
  char cVar66;
  uint uVar67;
  ulong uVar68;
  
  this_00 = &this->_internal_metadata_;
  this_01 = &this->top_;
  this_02 = &this->bottom_;
  do {
    pbVar4 = input->buffer_;
    uVar12 = 0;
    if (pbVar4 < input->buffer_end_) {
      bVar3 = *pbVar4;
      uVar12 = (uint32)bVar3;
      pbVar1 = pbVar4 + 1;
      uVar67 = (uint)bVar3;
      if ((char)bVar3 < '\x01') {
        if ((input->buffer_end_ <= pbVar1) || ((~(uint)*pbVar1 & uVar67) < 0x80)) goto LAB_00412721;
        uVar67 = ((uint)bVar3 + (uint)*pbVar1 * 0x80) - 0x80;
        input->buffer_ = pbVar4 + 2;
      }
      else {
        input->buffer_ = pbVar1;
      }
      uVar68 = (ulong)uVar67 | 0x100000000;
    }
    else {
LAB_00412721:
      uVar12 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar12);
      uVar68 = 0;
      if (uVar12 - 1 < 0x3fff) {
        uVar68 = 0x100000000;
      }
      uVar68 = uVar12 | uVar68;
    }
    uVar67 = (uint)uVar68;
    if ((uVar68 & 0x100000000) == 0) goto switchD_0041051b_default;
    uVar9 = (uint)(uVar68 >> 3) & 0x1fffffff;
    cVar66 = (char)uVar68;
    switch(uVar9) {
    case 100:
      if (cVar66 != '\"') goto switchD_0041051b_default;
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
      if (this->transform_param_ == (TransformationParameter *)0x0) {
        pTVar13 = (TransformationParameter *)operator_new(0x40);
        TransformationParameter::TransformationParameter(pTVar13);
        this->transform_param_ = pTVar13;
      }
      pTVar13 = this->transform_param_;
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar64 = (int)(char)*puVar7, -1 < (char)*puVar7)) {
        input->buffer_ = puVar7 + 1;
        bVar10 = true;
      }
      else {
        iVar64 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        bVar10 = -1 < iVar64;
      }
      iVar65 = 6;
      if (!bVar10) break;
      pVar60 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                         (input,iVar64);
      if ((long)pVar60 < 0) goto LAB_00412528;
      bVar10 = TransformationParameter::MergePartialFromCodedStream(pTVar13,input);
LAB_00412513:
      iVar65 = 6;
      if (bVar10 == false) goto LAB_00412528;
      bVar10 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                         (input,pVar60.first);
LAB_00412807:
      if (bVar10 == false) break;
      goto LAB_0041047f;
    case 0x65:
      if (cVar66 != '*') goto switchD_0041051b_default;
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 8;
      if (this->loss_param_ == (LossParameter *)0x0) {
        pLVar35 = (LossParameter *)operator_new(0x28);
        LossParameter::LossParameter(pLVar35);
        this->loss_param_ = pLVar35;
      }
      pLVar35 = this->loss_param_;
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar64 = (int)(char)*puVar7, -1 < (char)*puVar7)) {
        input->buffer_ = puVar7 + 1;
        bVar10 = true;
      }
      else {
        iVar64 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        bVar10 = -1 < iVar64;
      }
      iVar65 = 6;
      if (!bVar10) break;
      pVar60 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                         (input,iVar64);
      if (-1 < (long)pVar60) {
        bVar10 = LossParameter::MergePartialFromCodedStream(pLVar35,input);
        goto LAB_00412513;
      }
LAB_00412528:
      iVar65 = 6;
      break;
    case 0x66:
      if (cVar66 != '2') goto switchD_0041051b_default;
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x10;
      if (this->accuracy_param_ == (AccuracyParameter *)0x0) {
        pAVar31 = (AccuracyParameter *)operator_new(0x28);
        AccuracyParameter::AccuracyParameter(pAVar31);
        this->accuracy_param_ = pAVar31;
      }
      pAVar31 = this->accuracy_param_;
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar64 = (int)(char)*puVar7, -1 < (char)*puVar7)) {
        input->buffer_ = puVar7 + 1;
        bVar10 = true;
      }
      else {
        iVar64 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        bVar10 = -1 < iVar64;
      }
      iVar65 = 6;
      if (bVar10) {
        pVar60 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                           (input,iVar64);
        if (-1 < (long)pVar60) {
          bVar10 = AccuracyParameter::MergePartialFromCodedStream(pAVar31,input);
          goto LAB_00412513;
        }
        goto LAB_00412528;
      }
      break;
    case 0x67:
      if (cVar66 != ':') goto switchD_0041051b_default;
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x20;
      if (this->argmax_param_ == (ArgMaxParameter *)0x0) {
        pAVar33 = (ArgMaxParameter *)operator_new(0x28);
        ArgMaxParameter::ArgMaxParameter(pAVar33);
        this->argmax_param_ = pAVar33;
      }
      pAVar33 = this->argmax_param_;
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar64 = (int)(char)*puVar7, -1 < (char)*puVar7)) {
        input->buffer_ = puVar7 + 1;
        bVar10 = true;
      }
      else {
        iVar64 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        bVar10 = -1 < iVar64;
      }
      iVar65 = 6;
      if (bVar10) {
        pVar60 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                           (input,iVar64);
        if (-1 < (long)pVar60) {
          bVar10 = ArgMaxParameter::MergePartialFromCodedStream(pAVar33,input);
          goto LAB_00412513;
        }
        goto LAB_00412528;
      }
      break;
    case 0x68:
      if (cVar66 != 'B') goto switchD_0041051b_default;
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x40;
      if (this->concat_param_ == (ConcatParameter *)0x0) {
        pCVar25 = (ConcatParameter *)operator_new(0x20);
        ConcatParameter::ConcatParameter(pCVar25);
        this->concat_param_ = pCVar25;
      }
      pCVar25 = this->concat_param_;
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar64 = (int)(char)*puVar7, -1 < (char)*puVar7)) {
        input->buffer_ = puVar7 + 1;
        bVar10 = true;
      }
      else {
        iVar64 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        bVar10 = -1 < iVar64;
      }
      iVar65 = 6;
      if (bVar10) {
        pVar60 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                           (input,iVar64);
        if (-1 < (long)pVar60) {
          bVar10 = ConcatParameter::MergePartialFromCodedStream(pCVar25,input);
          goto LAB_00412513;
        }
        goto LAB_00412528;
      }
      break;
    case 0x69:
      if (cVar66 != 'J') goto switchD_0041051b_default;
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x80;
      if (this->contrastive_loss_param_ == (ContrastiveLossParameter *)0x0) {
        pCVar40 = (ContrastiveLossParameter *)operator_new(0x20);
        ContrastiveLossParameter::ContrastiveLossParameter(pCVar40);
        this->contrastive_loss_param_ = pCVar40;
      }
      pCVar40 = this->contrastive_loss_param_;
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar64 = (int)(char)*puVar7, -1 < (char)*puVar7)) {
        input->buffer_ = puVar7 + 1;
        bVar10 = true;
      }
      else {
        iVar64 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        bVar10 = -1 < iVar64;
      }
      iVar65 = 6;
      if (bVar10) {
        pVar60 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                           (input,iVar64);
        if (-1 < (long)pVar60) {
          bVar10 = ContrastiveLossParameter::MergePartialFromCodedStream(pCVar40,input);
          goto LAB_00412513;
        }
        goto LAB_00412528;
      }
      break;
    case 0x6a:
      if (cVar66 != 'R') goto switchD_0041051b_default;
      pbVar4 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
      *pbVar4 = *pbVar4 | 1;
      if (this->convolution_param_ == (ConvolutionParameter *)0x0) {
        pCVar43 = (ConvolutionParameter *)operator_new(0x98);
        ConvolutionParameter::ConvolutionParameter(pCVar43);
        this->convolution_param_ = pCVar43;
      }
      pCVar43 = this->convolution_param_;
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar64 = (int)(char)*puVar7, -1 < (char)*puVar7)) {
        input->buffer_ = puVar7 + 1;
        bVar10 = true;
      }
      else {
        iVar64 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        bVar10 = -1 < iVar64;
      }
      iVar65 = 6;
      if (bVar10) {
        pVar60 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                           (input,iVar64);
        if (-1 < (long)pVar60) {
          bVar10 = ConvolutionParameter::MergePartialFromCodedStream(pCVar43,input);
          goto LAB_00412513;
        }
        goto LAB_00412528;
      }
      break;
    case 0x6b:
      if (cVar66 != 'Z') goto switchD_0041051b_default;
      pbVar4 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
      *pbVar4 = *pbVar4 | 2;
      if (this->data_param_ == (DataParameter *)0x0) {
        pDVar34 = (DataParameter *)operator_new(0x48);
        DataParameter::DataParameter(pDVar34);
        this->data_param_ = pDVar34;
      }
      pDVar34 = this->data_param_;
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar64 = (int)(char)*puVar7, -1 < (char)*puVar7)) {
        input->buffer_ = puVar7 + 1;
        bVar10 = true;
      }
      else {
        iVar64 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        bVar10 = -1 < iVar64;
      }
      iVar65 = 6;
      if (bVar10) {
        pVar60 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                           (input,iVar64);
        if (-1 < (long)pVar60) {
          bVar10 = DataParameter::MergePartialFromCodedStream(pDVar34,input);
          goto LAB_00412513;
        }
        goto LAB_00412528;
      }
      break;
    case 0x6c:
      if (cVar66 != 'b') goto switchD_0041051b_default;
      pbVar4 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
      *pbVar4 = *pbVar4 | 4;
      if (this->dropout_param_ == (DropoutParameter *)0x0) {
        pDVar46 = (DropoutParameter *)operator_new(0x20);
        DropoutParameter::DropoutParameter(pDVar46);
        this->dropout_param_ = pDVar46;
      }
      pDVar46 = this->dropout_param_;
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar64 = (int)(char)*puVar7, -1 < (char)*puVar7)) {
        input->buffer_ = puVar7 + 1;
        bVar10 = true;
      }
      else {
        iVar64 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        bVar10 = -1 < iVar64;
      }
      iVar65 = 6;
      if (bVar10) {
        pVar60 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                           (input,iVar64);
        if (-1 < (long)pVar60) {
          bVar10 = DropoutParameter::MergePartialFromCodedStream(pDVar46,input);
          goto LAB_00412513;
        }
        goto LAB_00412528;
      }
      break;
    case 0x6d:
      if (cVar66 != 'j') goto switchD_0041051b_default;
      pbVar4 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
      *pbVar4 = *pbVar4 | 8;
      if (this->dummy_data_param_ == (DummyDataParameter *)0x0) {
        pDVar28 = (DummyDataParameter *)operator_new(0x88);
        DummyDataParameter::DummyDataParameter(pDVar28);
        this->dummy_data_param_ = pDVar28;
      }
      pDVar28 = this->dummy_data_param_;
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar64 = (int)(char)*puVar7, -1 < (char)*puVar7)) {
        input->buffer_ = puVar7 + 1;
        bVar10 = true;
      }
      else {
        iVar64 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        bVar10 = -1 < iVar64;
      }
      iVar65 = 6;
      if (bVar10) {
        pVar60 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                           (input,iVar64);
        if (-1 < (long)pVar60) {
          bVar10 = DummyDataParameter::MergePartialFromCodedStream(pDVar28,input);
          goto LAB_00412513;
        }
        goto LAB_00412528;
      }
      break;
    case 0x6e:
      if (cVar66 != 'r') goto switchD_0041051b_default;
      pbVar4 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
      *pbVar4 = *pbVar4 | 0x10;
      if (this->eltwise_param_ == (EltwiseParameter *)0x0) {
        pEVar45 = (EltwiseParameter *)operator_new(0x30);
        EltwiseParameter::EltwiseParameter(pEVar45);
        this->eltwise_param_ = pEVar45;
      }
      pEVar45 = this->eltwise_param_;
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar64 = (int)(char)*puVar7, -1 < (char)*puVar7)) {
        input->buffer_ = puVar7 + 1;
        bVar10 = true;
      }
      else {
        iVar64 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        bVar10 = -1 < iVar64;
      }
      iVar65 = 6;
      if (bVar10) {
        pVar60 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                           (input,iVar64);
        if (-1 < (long)pVar60) {
          bVar10 = EltwiseParameter::MergePartialFromCodedStream(pEVar45,input);
          goto LAB_00412513;
        }
        goto LAB_00412528;
      }
      break;
    case 0x6f:
      if (cVar66 != 'z') goto switchD_0041051b_default;
      pbVar4 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
      *pbVar4 = *pbVar4 | 0x20;
      if (this->exp_param_ == (ExpParameter *)0x0) {
        pEVar24 = (ExpParameter *)operator_new(0x28);
        ExpParameter::ExpParameter(pEVar24);
        this->exp_param_ = pEVar24;
      }
      pEVar24 = this->exp_param_;
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar64 = (int)(char)*puVar7, -1 < (char)*puVar7)) {
        input->buffer_ = puVar7 + 1;
        bVar10 = true;
      }
      else {
        iVar64 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        bVar10 = -1 < iVar64;
      }
      iVar65 = 6;
      if (bVar10) {
        pVar60 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                           (input,iVar64);
        if (-1 < (long)pVar60) {
          bVar10 = ExpParameter::MergePartialFromCodedStream(pEVar24,input);
          goto LAB_00412513;
        }
        goto LAB_00412528;
      }
      break;
    case 0x70:
      if (cVar66 != -0x7e) goto switchD_0041051b_default;
      pbVar4 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
      *pbVar4 = *pbVar4 | 0x40;
      if (this->hdf5_data_param_ == (HDF5DataParameter *)0x0) {
        pHVar27 = (HDF5DataParameter *)operator_new(0x28);
        HDF5DataParameter::HDF5DataParameter(pHVar27);
        this->hdf5_data_param_ = pHVar27;
      }
      pHVar27 = this->hdf5_data_param_;
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar64 = (int)(char)*puVar7, -1 < (char)*puVar7)) {
        input->buffer_ = puVar7 + 1;
        bVar10 = true;
      }
      else {
        iVar64 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        bVar10 = -1 < iVar64;
      }
      iVar65 = 6;
      if (bVar10) {
        pVar60 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                           (input,iVar64);
        if (-1 < (long)pVar60) {
          bVar10 = HDF5DataParameter::MergePartialFromCodedStream(pHVar27,input);
          goto LAB_00412513;
        }
        goto LAB_00412528;
      }
      break;
    case 0x71:
      if (cVar66 != -0x76) goto switchD_0041051b_default;
      pbVar4 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
      *pbVar4 = *pbVar4 | 0x80;
      if (this->hdf5_output_param_ == (HDF5OutputParameter *)0x0) {
        pHVar42 = (HDF5OutputParameter *)operator_new(0x20);
        HDF5OutputParameter::HDF5OutputParameter(pHVar42);
        this->hdf5_output_param_ = pHVar42;
      }
      pHVar42 = this->hdf5_output_param_;
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar64 = (int)(char)*puVar7, -1 < (char)*puVar7)) {
        input->buffer_ = puVar7 + 1;
        bVar10 = true;
      }
      else {
        iVar64 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        bVar10 = -1 < iVar64;
      }
      iVar65 = 6;
      if (bVar10) {
        pVar60 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                           (input,iVar64);
        if (-1 < (long)pVar60) {
          bVar10 = HDF5OutputParameter::MergePartialFromCodedStream(pHVar42,input);
          goto LAB_00412513;
        }
        goto LAB_00412528;
      }
      break;
    case 0x72:
      if (cVar66 != -0x6e) goto switchD_0041051b_default;
      pbVar4 = (byte *)((long)(this->_has_bits_).has_bits_ + 2);
      *pbVar4 = *pbVar4 | 1;
      if (this->hinge_loss_param_ == (HingeLossParameter *)0x0) {
        pHVar22 = (HingeLossParameter *)operator_new(0x20);
        HingeLossParameter::HingeLossParameter(pHVar22);
        this->hinge_loss_param_ = pHVar22;
      }
      pHVar22 = this->hinge_loss_param_;
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar64 = (int)(char)*puVar7, -1 < (char)*puVar7)) {
        input->buffer_ = puVar7 + 1;
        bVar10 = true;
      }
      else {
        iVar64 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        bVar10 = -1 < iVar64;
      }
      iVar65 = 6;
      if (bVar10) {
        pVar60 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                           (input,iVar64);
        if (-1 < (long)pVar60) {
          bVar10 = HingeLossParameter::MergePartialFromCodedStream(pHVar22,input);
          goto LAB_00412513;
        }
        goto LAB_00412528;
      }
      break;
    case 0x73:
      if (cVar66 != -0x66) goto switchD_0041051b_default;
      pbVar4 = (byte *)((long)(this->_has_bits_).has_bits_ + 2);
      *pbVar4 = *pbVar4 | 2;
      if (this->image_data_param_ == (ImageDataParameter *)0x0) {
        pIVar32 = (ImageDataParameter *)operator_new(0x50);
        ImageDataParameter::ImageDataParameter(pIVar32);
        this->image_data_param_ = pIVar32;
      }
      pIVar32 = this->image_data_param_;
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar64 = (int)(char)*puVar7, -1 < (char)*puVar7)) {
        input->buffer_ = puVar7 + 1;
        bVar10 = true;
      }
      else {
        iVar64 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        bVar10 = -1 < iVar64;
      }
      iVar65 = 6;
      if (bVar10) {
        pVar60 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                           (input,iVar64);
        if (-1 < (long)pVar60) {
          bVar10 = ImageDataParameter::MergePartialFromCodedStream(pIVar32,input);
          goto LAB_00412513;
        }
        goto LAB_00412528;
      }
      break;
    case 0x74:
      if (cVar66 != -0x5e) goto switchD_0041051b_default;
      pbVar4 = (byte *)((long)(this->_has_bits_).has_bits_ + 2);
      *pbVar4 = *pbVar4 | 4;
      if (this->infogain_loss_param_ == (InfogainLossParameter *)0x0) {
        pIVar20 = (InfogainLossParameter *)operator_new(0x20);
        InfogainLossParameter::InfogainLossParameter(pIVar20);
        this->infogain_loss_param_ = pIVar20;
      }
      pIVar20 = this->infogain_loss_param_;
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar64 = (int)(char)*puVar7, -1 < (char)*puVar7)) {
        input->buffer_ = puVar7 + 1;
        bVar10 = true;
      }
      else {
        iVar64 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        bVar10 = -1 < iVar64;
      }
      iVar65 = 6;
      if (bVar10) {
        pVar60 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                           (input,iVar64);
        if (-1 < (long)pVar60) {
          bVar10 = InfogainLossParameter::MergePartialFromCodedStream(pIVar20,input);
          goto LAB_00412513;
        }
        goto LAB_00412528;
      }
      break;
    case 0x75:
      if (cVar66 != -0x56) goto switchD_0041051b_default;
      pbVar4 = (byte *)((long)(this->_has_bits_).has_bits_ + 2);
      *pbVar4 = *pbVar4 | 8;
      if (this->inner_product_param_ == (InnerProductParameter *)0x0) {
        pIVar37 = (InnerProductParameter *)operator_new(0x38);
        InnerProductParameter::InnerProductParameter(pIVar37);
        this->inner_product_param_ = pIVar37;
      }
      pIVar37 = this->inner_product_param_;
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar64 = (int)(char)*puVar7, -1 < (char)*puVar7)) {
        input->buffer_ = puVar7 + 1;
        bVar10 = true;
      }
      else {
        iVar64 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        bVar10 = -1 < iVar64;
      }
      iVar65 = 6;
      if (bVar10) {
        pVar60 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                           (input,iVar64);
        if (-1 < (long)pVar60) {
          bVar10 = InnerProductParameter::MergePartialFromCodedStream(pIVar37,input);
          goto LAB_00412513;
        }
        goto LAB_00412528;
      }
      break;
    case 0x76:
      if (cVar66 != -0x4e) goto switchD_0041051b_default;
      pbVar4 = (byte *)((long)(this->_has_bits_).has_bits_ + 2);
      *pbVar4 = *pbVar4 | 0x10;
      if (this->lrn_param_ == (LRNParameter *)0x0) {
        pLVar44 = (LRNParameter *)operator_new(0x30);
        LRNParameter::LRNParameter(pLVar44);
        this->lrn_param_ = pLVar44;
      }
      pLVar44 = this->lrn_param_;
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar64 = (int)(char)*puVar7, -1 < (char)*puVar7)) {
        input->buffer_ = puVar7 + 1;
        bVar10 = true;
      }
      else {
        iVar64 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        bVar10 = -1 < iVar64;
      }
      iVar65 = 6;
      if (bVar10) {
        pVar60 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                           (input,iVar64);
        if (-1 < (long)pVar60) {
          bVar10 = LRNParameter::MergePartialFromCodedStream(pLVar44,input);
          goto LAB_00412513;
        }
        goto LAB_00412528;
      }
      break;
    case 0x77:
      if (cVar66 != -0x46) goto switchD_0041051b_default;
      pbVar4 = (byte *)((long)(this->_has_bits_).has_bits_ + 2);
      *pbVar4 = *pbVar4 | 0x20;
      if (this->memory_data_param_ == (MemoryDataParameter *)0x0) {
        pMVar52 = (MemoryDataParameter *)operator_new(0x28);
        MemoryDataParameter::MemoryDataParameter(pMVar52);
        this->memory_data_param_ = pMVar52;
      }
      pMVar52 = this->memory_data_param_;
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar64 = (int)(char)*puVar7, -1 < (char)*puVar7)) {
        input->buffer_ = puVar7 + 1;
        bVar10 = true;
      }
      else {
        iVar64 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        bVar10 = -1 < iVar64;
      }
      iVar65 = 6;
      if (bVar10) {
        pVar60 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                           (input,iVar64);
        if (-1 < (long)pVar60) {
          bVar10 = MemoryDataParameter::MergePartialFromCodedStream(pMVar52,input);
          goto LAB_00412513;
        }
        goto LAB_00412528;
      }
      break;
    case 0x78:
      if (cVar66 != -0x3e) goto switchD_0041051b_default;
      pbVar4 = (byte *)((long)(this->_has_bits_).has_bits_ + 2);
      *pbVar4 = *pbVar4 | 0x40;
      if (this->mvn_param_ == (MVNParameter *)0x0) {
        pMVar39 = (MVNParameter *)operator_new(0x20);
        MVNParameter::MVNParameter(pMVar39);
        this->mvn_param_ = pMVar39;
      }
      pMVar39 = this->mvn_param_;
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar64 = (int)(char)*puVar7, -1 < (char)*puVar7)) {
        input->buffer_ = puVar7 + 1;
        bVar10 = true;
      }
      else {
        iVar64 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        bVar10 = -1 < iVar64;
      }
      iVar65 = 6;
      if (bVar10) {
        pVar60 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                           (input,iVar64);
        if (-1 < (long)pVar60) {
          bVar10 = MVNParameter::MergePartialFromCodedStream(pMVar39,input);
          goto LAB_00412513;
        }
        goto LAB_00412528;
      }
      break;
    case 0x79:
      if (cVar66 != -0x36) goto switchD_0041051b_default;
      pbVar4 = (byte *)((long)(this->_has_bits_).has_bits_ + 2);
      *pbVar4 = *pbVar4 | 0x80;
      if (this->pooling_param_ == (PoolingParameter *)0x0) {
        pPVar41 = (PoolingParameter *)operator_new(0x48);
        PoolingParameter::PoolingParameter(pPVar41);
        this->pooling_param_ = pPVar41;
      }
      pPVar41 = this->pooling_param_;
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar64 = (int)(char)*puVar7, -1 < (char)*puVar7)) {
        input->buffer_ = puVar7 + 1;
        bVar10 = true;
      }
      else {
        iVar64 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        bVar10 = -1 < iVar64;
      }
      iVar65 = 6;
      if (bVar10) {
        pVar60 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                           (input,iVar64);
        if (-1 < (long)pVar60) {
          bVar10 = PoolingParameter::MergePartialFromCodedStream(pPVar41,input);
          goto LAB_00412513;
        }
        goto LAB_00412528;
      }
      break;
    case 0x7a:
      if (cVar66 != -0x2e) goto switchD_0041051b_default;
      pbVar4 = (byte *)((long)(this->_has_bits_).has_bits_ + 3);
      *pbVar4 = *pbVar4 | 1;
      if (this->power_param_ == (PowerParameter *)0x0) {
        pPVar50 = (PowerParameter *)operator_new(0x28);
        PowerParameter::PowerParameter(pPVar50);
        this->power_param_ = pPVar50;
      }
      pPVar50 = this->power_param_;
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar64 = (int)(char)*puVar7, -1 < (char)*puVar7)) {
        input->buffer_ = puVar7 + 1;
        bVar10 = true;
      }
      else {
        iVar64 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        bVar10 = -1 < iVar64;
      }
      iVar65 = 6;
      if (bVar10) {
        pVar60 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                           (input,iVar64);
        if (-1 < (long)pVar60) {
          bVar10 = PowerParameter::MergePartialFromCodedStream(pPVar50,input);
          goto LAB_00412513;
        }
        goto LAB_00412528;
      }
      break;
    case 0x7b:
      if (cVar66 != -0x26) goto switchD_0041051b_default;
      pbVar4 = (byte *)((long)(this->_has_bits_).has_bits_ + 3);
      *pbVar4 = *pbVar4 | 2;
      if (this->relu_param_ == (ReLUParameter *)0x0) {
        pRVar54 = (ReLUParameter *)operator_new(0x20);
        ReLUParameter::ReLUParameter(pRVar54);
        this->relu_param_ = pRVar54;
      }
      pRVar54 = this->relu_param_;
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar64 = (int)(char)*puVar7, -1 < (char)*puVar7)) {
        input->buffer_ = puVar7 + 1;
        bVar10 = true;
      }
      else {
        iVar64 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        bVar10 = -1 < iVar64;
      }
      iVar65 = 6;
      if (bVar10) {
        pVar60 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                           (input,iVar64);
        if (-1 < (long)pVar60) {
          bVar10 = ReLUParameter::MergePartialFromCodedStream(pRVar54,input);
          goto LAB_00412513;
        }
        goto LAB_00412528;
      }
      break;
    case 0x7c:
      if (cVar66 != -0x1e) goto switchD_0041051b_default;
      pbVar4 = (byte *)((long)(this->_has_bits_).has_bits_ + 3);
      *pbVar4 = *pbVar4 | 4;
      if (this->sigmoid_param_ == (SigmoidParameter *)0x0) {
        pSVar30 = (SigmoidParameter *)operator_new(0x20);
        SigmoidParameter::SigmoidParameter(pSVar30);
        this->sigmoid_param_ = pSVar30;
      }
      pSVar30 = this->sigmoid_param_;
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar64 = (int)(char)*puVar7, -1 < (char)*puVar7)) {
        input->buffer_ = puVar7 + 1;
        bVar10 = true;
      }
      else {
        iVar64 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        bVar10 = -1 < iVar64;
      }
      iVar65 = 6;
      if (bVar10) {
        pVar60 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                           (input,iVar64);
        if (-1 < (long)pVar60) {
          bVar10 = SigmoidParameter::MergePartialFromCodedStream(pSVar30,input);
          goto LAB_00412513;
        }
        goto LAB_00412528;
      }
      break;
    case 0x7d:
      if (cVar66 != -0x16) goto switchD_0041051b_default;
      pbVar4 = (byte *)((long)(this->_has_bits_).has_bits_ + 3);
      *pbVar4 = *pbVar4 | 8;
      if (this->softmax_param_ == (SoftmaxParameter *)0x0) {
        pSVar29 = (SoftmaxParameter *)operator_new(0x20);
        SoftmaxParameter::SoftmaxParameter(pSVar29);
        this->softmax_param_ = pSVar29;
      }
      pSVar29 = this->softmax_param_;
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar64 = (int)(char)*puVar7, -1 < (char)*puVar7)) {
        input->buffer_ = puVar7 + 1;
        bVar10 = true;
      }
      else {
        iVar64 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        bVar10 = -1 < iVar64;
      }
      iVar65 = 6;
      if (bVar10) {
        pVar60 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                           (input,iVar64);
        if (-1 < (long)pVar60) {
          bVar10 = SoftmaxParameter::MergePartialFromCodedStream(pSVar29,input);
          goto LAB_00412513;
        }
        goto LAB_00412528;
      }
      break;
    case 0x7e:
      if (cVar66 != -0xe) goto switchD_0041051b_default;
      pbVar4 = (byte *)((long)(this->_has_bits_).has_bits_ + 3);
      *pbVar4 = *pbVar4 | 0x10;
      if (this->slice_param_ == (SliceParameter *)0x0) {
        pSVar58 = (SliceParameter *)operator_new(0x30);
        SliceParameter::SliceParameter(pSVar58);
        this->slice_param_ = pSVar58;
      }
      pSVar58 = this->slice_param_;
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar64 = (int)(char)*puVar7, -1 < (char)*puVar7)) {
        input->buffer_ = puVar7 + 1;
        bVar10 = true;
      }
      else {
        iVar64 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        bVar10 = -1 < iVar64;
      }
      iVar65 = 6;
      if (bVar10) {
        pVar60 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                           (input,iVar64);
        if (-1 < (long)pVar60) {
          bVar10 = SliceParameter::MergePartialFromCodedStream(pSVar58,input);
          goto LAB_00412513;
        }
        goto LAB_00412528;
      }
      break;
    case 0x7f:
      if (cVar66 != -6) goto switchD_0041051b_default;
      pbVar4 = (byte *)((long)(this->_has_bits_).has_bits_ + 3);
      *pbVar4 = *pbVar4 | 0x20;
      if (this->tanh_param_ == (TanHParameter *)0x0) {
        pTVar18 = (TanHParameter *)operator_new(0x20);
        TanHParameter::TanHParameter(pTVar18);
        this->tanh_param_ = pTVar18;
      }
      pTVar18 = this->tanh_param_;
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar64 = (int)(char)*puVar7, -1 < (char)*puVar7)) {
        input->buffer_ = puVar7 + 1;
        bVar10 = true;
      }
      else {
        iVar64 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        bVar10 = -1 < iVar64;
      }
      iVar65 = 6;
      if (bVar10) {
        pVar60 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                           (input,iVar64);
        if (-1 < (long)pVar60) {
          bVar10 = TanHParameter::MergePartialFromCodedStream(pTVar18,input);
          goto LAB_00412513;
        }
        goto LAB_00412528;
      }
      break;
    case 0x80:
      if (cVar66 != '\x02') goto switchD_0041051b_default;
      pbVar4 = (byte *)((long)(this->_has_bits_).has_bits_ + 3);
      *pbVar4 = *pbVar4 | 0x40;
      if (this->threshold_param_ == (ThresholdParameter *)0x0) {
        pTVar55 = (ThresholdParameter *)operator_new(0x20);
        ThresholdParameter::ThresholdParameter(pTVar55);
        this->threshold_param_ = pTVar55;
      }
      pTVar55 = this->threshold_param_;
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar64 = (int)(char)*puVar7, -1 < (char)*puVar7)) {
        input->buffer_ = puVar7 + 1;
        bVar10 = true;
      }
      else {
        iVar64 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        bVar10 = -1 < iVar64;
      }
      iVar65 = 6;
      if (bVar10) {
        pVar60 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                           (input,iVar64);
        if (-1 < (long)pVar60) {
          bVar10 = ThresholdParameter::MergePartialFromCodedStream(pTVar55,input);
          goto LAB_00412513;
        }
        goto LAB_00412528;
      }
      break;
    case 0x81:
      if (cVar66 != '\n') goto switchD_0041051b_default;
      pbVar4 = (byte *)((long)(this->_has_bits_).has_bits_ + 3);
      *pbVar4 = *pbVar4 | 0x80;
      if (this->window_data_param_ == (WindowDataParameter *)0x0) {
        pWVar56 = (WindowDataParameter *)operator_new(0x58);
        WindowDataParameter::WindowDataParameter(pWVar56);
        this->window_data_param_ = pWVar56;
      }
      pWVar56 = this->window_data_param_;
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar64 = (int)(char)*puVar7, -1 < (char)*puVar7)) {
        input->buffer_ = puVar7 + 1;
        bVar10 = true;
      }
      else {
        iVar64 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        bVar10 = -1 < iVar64;
      }
      iVar65 = 6;
      if (bVar10) {
        pVar60 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                           (input,iVar64);
        if (-1 < (long)pVar60) {
          bVar10 = WindowDataParameter::MergePartialFromCodedStream(pWVar56,input);
          goto LAB_00412513;
        }
        goto LAB_00412528;
      }
      break;
    case 0x82:
      if (cVar66 != '\x12') goto switchD_0041051b_default;
      puVar2 = (this->_has_bits_).has_bits_ + 1;
      *(byte *)puVar2 = (byte)*puVar2 | 1;
      if (this->python_param_ == (PythonParameter *)0x0) {
        pPVar47 = (PythonParameter *)operator_new(0x38);
        PythonParameter::PythonParameter(pPVar47);
        this->python_param_ = pPVar47;
      }
      pPVar47 = this->python_param_;
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar64 = (int)(char)*puVar7, -1 < (char)*puVar7)) {
        input->buffer_ = puVar7 + 1;
        bVar10 = true;
      }
      else {
        iVar64 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        bVar10 = -1 < iVar64;
      }
      iVar65 = 6;
      if (bVar10) {
        pVar60 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                           (input,iVar64);
        if (-1 < (long)pVar60) {
          bVar10 = PythonParameter::MergePartialFromCodedStream(pPVar47,input);
          goto LAB_00412513;
        }
        goto LAB_00412528;
      }
      break;
    case 0x83:
      if (cVar66 != '\x1a') goto switchD_0041051b_default;
      puVar2 = (this->_has_bits_).has_bits_ + 1;
      *(byte *)puVar2 = (byte)*puVar2 | 2;
      if (this->prelu_param_ == (PReLUParameter *)0x0) {
        pPVar36 = (PReLUParameter *)operator_new(0x28);
        PReLUParameter::PReLUParameter(pPVar36);
        this->prelu_param_ = pPVar36;
      }
      pPVar36 = this->prelu_param_;
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar64 = (int)(char)*puVar7, -1 < (char)*puVar7)) {
        input->buffer_ = puVar7 + 1;
        bVar10 = true;
      }
      else {
        iVar64 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        bVar10 = -1 < iVar64;
      }
      iVar65 = 6;
      if (bVar10) {
        pVar60 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                           (input,iVar64);
        if (-1 < (long)pVar60) {
          bVar10 = PReLUParameter::MergePartialFromCodedStream(pPVar36,input);
          goto LAB_00412513;
        }
        goto LAB_00412528;
      }
      break;
    case 0x84:
      if (cVar66 != '\"') goto switchD_0041051b_default;
      puVar2 = (this->_has_bits_).has_bits_ + 1;
      *(byte *)puVar2 = (byte)*puVar2 | 4;
      if (this->spp_param_ == (SPPParameter *)0x0) {
        pSVar48 = (SPPParameter *)operator_new(0x28);
        SPPParameter::SPPParameter(pSVar48);
        this->spp_param_ = pSVar48;
      }
      pSVar48 = this->spp_param_;
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar64 = (int)(char)*puVar7, -1 < (char)*puVar7)) {
        input->buffer_ = puVar7 + 1;
        bVar10 = true;
      }
      else {
        iVar64 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        bVar10 = -1 < iVar64;
      }
      iVar65 = 6;
      if (bVar10) {
        pVar60 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                           (input,iVar64);
        if (-1 < (long)pVar60) {
          bVar10 = SPPParameter::MergePartialFromCodedStream(pSVar48,input);
          goto LAB_00412513;
        }
        goto LAB_00412528;
      }
      break;
    case 0x85:
      if (cVar66 != '*') goto switchD_0041051b_default;
      puVar2 = (this->_has_bits_).has_bits_ + 1;
      *(byte *)puVar2 = (byte)*puVar2 | 8;
      if (this->reshape_param_ == (ReshapeParameter *)0x0) {
        pRVar23 = (ReshapeParameter *)operator_new(0x28);
        ReshapeParameter::ReshapeParameter(pRVar23);
        this->reshape_param_ = pRVar23;
      }
      pRVar23 = this->reshape_param_;
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar64 = (int)(char)*puVar7, -1 < (char)*puVar7)) {
        input->buffer_ = puVar7 + 1;
        bVar10 = true;
      }
      else {
        iVar64 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        bVar10 = -1 < iVar64;
      }
      iVar65 = 6;
      if (bVar10) {
        pVar60 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                           (input,iVar64);
        if (-1 < (long)pVar60) {
          bVar10 = ReshapeParameter::MergePartialFromCodedStream(pRVar23,input);
          goto LAB_00412513;
        }
        goto LAB_00412528;
      }
      break;
    case 0x86:
      if (cVar66 != '2') goto switchD_0041051b_default;
      puVar2 = (this->_has_bits_).has_bits_ + 1;
      *(byte *)puVar2 = (byte)*puVar2 | 0x10;
      if (this->log_param_ == (LogParameter *)0x0) {
        pLVar19 = (LogParameter *)operator_new(0x28);
        LogParameter::LogParameter(pLVar19);
        this->log_param_ = pLVar19;
      }
      pLVar19 = this->log_param_;
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar64 = (int)(char)*puVar7, -1 < (char)*puVar7)) {
        input->buffer_ = puVar7 + 1;
        bVar10 = true;
      }
      else {
        iVar64 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        bVar10 = -1 < iVar64;
      }
      iVar65 = 6;
      if (bVar10) {
        pVar60 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                           (input,iVar64);
        if (-1 < (long)pVar60) {
          bVar10 = LogParameter::MergePartialFromCodedStream(pLVar19,input);
          goto LAB_00412513;
        }
        goto LAB_00412528;
      }
      break;
    case 0x87:
      if (cVar66 != ':') goto switchD_0041051b_default;
      puVar2 = (this->_has_bits_).has_bits_ + 1;
      *(byte *)puVar2 = (byte)*puVar2 | 0x20;
      if (this->flatten_param_ == (FlattenParameter *)0x0) {
        pFVar16 = (FlattenParameter *)operator_new(0x20);
        FlattenParameter::FlattenParameter(pFVar16);
        this->flatten_param_ = pFVar16;
      }
      pFVar16 = this->flatten_param_;
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar64 = (int)(char)*puVar7, -1 < (char)*puVar7)) {
        input->buffer_ = puVar7 + 1;
        bVar10 = true;
      }
      else {
        iVar64 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        bVar10 = -1 < iVar64;
      }
      iVar65 = 6;
      if (bVar10) {
        pVar60 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                           (input,iVar64);
        if (-1 < (long)pVar60) {
          bVar10 = FlattenParameter::MergePartialFromCodedStream(pFVar16,input);
          goto LAB_00412513;
        }
        goto LAB_00412528;
      }
      break;
    case 0x88:
      if (cVar66 != 'B') goto switchD_0041051b_default;
      puVar2 = (this->_has_bits_).has_bits_ + 1;
      *(byte *)puVar2 = (byte)*puVar2 | 0x40;
      if (this->reduction_param_ == (ReductionParameter *)0x0) {
        pRVar17 = (ReductionParameter *)operator_new(0x28);
        ReductionParameter::ReductionParameter(pRVar17);
        this->reduction_param_ = pRVar17;
      }
      pRVar17 = this->reduction_param_;
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar64 = (int)(char)*puVar7, -1 < (char)*puVar7)) {
        input->buffer_ = puVar7 + 1;
        bVar10 = true;
      }
      else {
        iVar64 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        bVar10 = -1 < iVar64;
      }
      iVar65 = 6;
      if (bVar10) {
        pVar60 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                           (input,iVar64);
        if (-1 < (long)pVar60) {
          bVar10 = ReductionParameter::MergePartialFromCodedStream(pRVar17,input);
          goto LAB_00412513;
        }
        goto LAB_00412528;
      }
      break;
    case 0x89:
      if (cVar66 != 'J') goto switchD_0041051b_default;
      puVar2 = (this->_has_bits_).has_bits_ + 1;
      *(byte *)puVar2 = (byte)*puVar2 | 0x80;
      if (this->embed_param_ == (EmbedParameter *)0x0) {
        pEVar15 = (EmbedParameter *)operator_new(0x38);
        EmbedParameter::EmbedParameter(pEVar15);
        this->embed_param_ = pEVar15;
      }
      pEVar15 = this->embed_param_;
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar64 = (int)(char)*puVar7, -1 < (char)*puVar7)) {
        input->buffer_ = puVar7 + 1;
        bVar10 = true;
      }
      else {
        iVar64 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        bVar10 = -1 < iVar64;
      }
      iVar65 = 6;
      if (bVar10) {
        pVar60 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                           (input,iVar64);
        if (-1 < (long)pVar60) {
          bVar10 = EmbedParameter::MergePartialFromCodedStream(pEVar15,input);
          goto LAB_00412513;
        }
        goto LAB_00412528;
      }
      break;
    case 0x8a:
      if (cVar66 != 'R') goto switchD_0041051b_default;
      pbVar4 = (byte *)((long)(this->_has_bits_).has_bits_ + 5);
      *pbVar4 = *pbVar4 | 1;
      if (this->tile_param_ == (TileParameter *)0x0) {
        pTVar57 = (TileParameter *)operator_new(0x20);
        TileParameter::TileParameter(pTVar57);
        this->tile_param_ = pTVar57;
      }
      pTVar57 = this->tile_param_;
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar64 = (int)(char)*puVar7, -1 < (char)*puVar7)) {
        input->buffer_ = puVar7 + 1;
        bVar10 = true;
      }
      else {
        iVar64 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        bVar10 = -1 < iVar64;
      }
      iVar65 = 6;
      if (bVar10) {
        pVar60 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                           (input,iVar64);
        if (-1 < (long)pVar60) {
          bVar10 = TileParameter::MergePartialFromCodedStream(pTVar57,input);
          goto LAB_00412513;
        }
        goto LAB_00412528;
      }
      break;
    case 0x8b:
      if (cVar66 != 'Z') goto switchD_0041051b_default;
      pbVar4 = (byte *)((long)(this->_has_bits_).has_bits_ + 5);
      *pbVar4 = *pbVar4 | 2;
      if (this->batch_norm_param_ == (BatchNormParameter *)0x0) {
        pBVar51 = (BatchNormParameter *)operator_new(0x28);
        BatchNormParameter::BatchNormParameter(pBVar51);
        this->batch_norm_param_ = pBVar51;
      }
      pBVar51 = this->batch_norm_param_;
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar64 = (int)(char)*puVar7, -1 < (char)*puVar7)) {
        input->buffer_ = puVar7 + 1;
        bVar10 = true;
      }
      else {
        iVar64 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        bVar10 = -1 < iVar64;
      }
      iVar65 = 6;
      if (bVar10) {
        pVar60 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                           (input,iVar64);
        if (-1 < (long)pVar60) {
          bVar10 = BatchNormParameter::MergePartialFromCodedStream(pBVar51,input);
          goto LAB_00412513;
        }
        goto LAB_00412528;
      }
      break;
    case 0x8c:
      if (cVar66 != 'b') goto switchD_0041051b_default;
      pbVar4 = (byte *)((long)(this->_has_bits_).has_bits_ + 5);
      *pbVar4 = *pbVar4 | 4;
      if (this->elu_param_ == (ELUParameter *)0x0) {
        pEVar26 = (ELUParameter *)operator_new(0x20);
        ELUParameter::ELUParameter(pEVar26);
        this->elu_param_ = pEVar26;
      }
      pEVar26 = this->elu_param_;
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar64 = (int)(char)*puVar7, -1 < (char)*puVar7)) {
        input->buffer_ = puVar7 + 1;
        bVar10 = true;
      }
      else {
        iVar64 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        bVar10 = -1 < iVar64;
      }
      iVar65 = 6;
      if (bVar10) {
        pVar60 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                           (input,iVar64);
        if (-1 < (long)pVar60) {
          bVar10 = ELUParameter::MergePartialFromCodedStream(pEVar26,input);
          goto LAB_00412513;
        }
        goto LAB_00412528;
      }
      break;
    case 0x8d:
      if (cVar66 != 'j') goto switchD_0041051b_default;
      pbVar4 = (byte *)((long)(this->_has_bits_).has_bits_ + 5);
      *pbVar4 = *pbVar4 | 8;
      if (this->bias_param_ == (BiasParameter *)0x0) {
        pBVar38 = (BiasParameter *)operator_new(0x28);
        BiasParameter::BiasParameter(pBVar38);
        this->bias_param_ = pBVar38;
      }
      pBVar38 = this->bias_param_;
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar64 = (int)(char)*puVar7, -1 < (char)*puVar7)) {
        input->buffer_ = puVar7 + 1;
        bVar10 = true;
      }
      else {
        iVar64 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        bVar10 = -1 < iVar64;
      }
      iVar65 = 6;
      if (bVar10) {
        pVar60 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                           (input,iVar64);
        if (-1 < (long)pVar60) {
          bVar10 = BiasParameter::MergePartialFromCodedStream(pBVar38,input);
          goto LAB_00412513;
        }
        goto LAB_00412528;
      }
      break;
    case 0x8e:
      if (cVar66 != 'r') goto switchD_0041051b_default;
      pbVar4 = (byte *)((long)(this->_has_bits_).has_bits_ + 5);
      *pbVar4 = *pbVar4 | 0x10;
      if (this->scale_param_ == (ScaleParameter *)0x0) {
        pSVar53 = (ScaleParameter *)operator_new(0x38);
        ScaleParameter::ScaleParameter(pSVar53);
        this->scale_param_ = pSVar53;
      }
      pSVar53 = this->scale_param_;
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar64 = (int)(char)*puVar7, -1 < (char)*puVar7)) {
        input->buffer_ = puVar7 + 1;
        bVar10 = true;
      }
      else {
        iVar64 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        bVar10 = -1 < iVar64;
      }
      iVar65 = 6;
      if (bVar10) {
        pVar60 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                           (input,iVar64);
        if (-1 < (long)pVar60) {
          bVar10 = ScaleParameter::MergePartialFromCodedStream(pSVar53,input);
          goto LAB_00412513;
        }
        goto LAB_00412528;
      }
      break;
    case 0x8f:
      if (cVar66 != 'z') goto switchD_0041051b_default;
      pbVar4 = (byte *)((long)(this->_has_bits_).has_bits_ + 5);
      *pbVar4 = *pbVar4 | 0x20;
      if (this->input_param_ == (InputParameter *)0x0) {
        pIVar14 = (InputParameter *)operator_new(0x30);
        InputParameter::InputParameter(pIVar14);
        this->input_param_ = pIVar14;
      }
      pIVar14 = this->input_param_;
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar64 = (int)(char)*puVar7, -1 < (char)*puVar7)) {
        input->buffer_ = puVar7 + 1;
        bVar10 = true;
      }
      else {
        iVar64 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        bVar10 = -1 < iVar64;
      }
      iVar65 = 6;
      if (bVar10) {
        pVar60 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                           (input,iVar64);
        if (-1 < (long)pVar60) {
          bVar10 = InputParameter::MergePartialFromCodedStream(pIVar14,input);
          goto LAB_00412513;
        }
        goto LAB_00412528;
      }
      break;
    case 0x90:
      if (cVar66 != -0x7e) goto switchD_0041051b_default;
      pbVar4 = (byte *)((long)(this->_has_bits_).has_bits_ + 5);
      *pbVar4 = *pbVar4 | 0x40;
      if (this->crop_param_ == (CropParameter *)0x0) {
        pCVar21 = (CropParameter *)operator_new(0x30);
        CropParameter::CropParameter(pCVar21);
        this->crop_param_ = pCVar21;
      }
      pCVar21 = this->crop_param_;
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar64 = (int)(char)*puVar7, -1 < (char)*puVar7)) {
        input->buffer_ = puVar7 + 1;
        bVar10 = true;
      }
      else {
        iVar64 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        bVar10 = -1 < iVar64;
      }
      iVar65 = 6;
      if (bVar10) {
        pVar60 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                           (input,iVar64);
        if (-1 < (long)pVar60) {
          bVar10 = CropParameter::MergePartialFromCodedStream(pCVar21,input);
          goto LAB_00412513;
        }
        goto LAB_00412528;
      }
      break;
    case 0x91:
      if (cVar66 != -0x76) goto switchD_0041051b_default;
      pbVar4 = (byte *)((long)(this->_has_bits_).has_bits_ + 5);
      *pbVar4 = *pbVar4 | 0x80;
      if (this->parameter_param_ == (ParameterParameter *)0x0) {
        pPVar49 = (ParameterParameter *)operator_new(0x20);
        ParameterParameter::ParameterParameter(pPVar49);
        this->parameter_param_ = pPVar49;
      }
      pPVar49 = this->parameter_param_;
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar64 = (int)(char)*puVar7, -1 < (char)*puVar7)) {
        input->buffer_ = puVar7 + 1;
        bVar10 = true;
      }
      else {
        iVar64 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        bVar10 = -1 < iVar64;
      }
      iVar65 = 6;
      if (bVar10) {
        pVar60 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                           (input,iVar64);
        if (-1 < (long)pVar60) {
          bVar10 = ParameterParameter::MergePartialFromCodedStream(pPVar49,input);
          goto LAB_00412513;
        }
        goto LAB_00412528;
      }
      break;
    case 0x92:
      if (cVar66 != -0x6e) goto switchD_0041051b_default;
      pbVar4 = (byte *)((long)(this->_has_bits_).has_bits_ + 6);
      *pbVar4 = *pbVar4 | 1;
      if (this->recurrent_param_ == (RecurrentParameter *)0x0) {
        pRVar59 = (RecurrentParameter *)operator_new(0x30);
        RecurrentParameter::RecurrentParameter(pRVar59);
        this->recurrent_param_ = pRVar59;
      }
      pRVar59 = this->recurrent_param_;
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar64 = (int)(char)*puVar7, -1 < (char)*puVar7)) {
        input->buffer_ = puVar7 + 1;
        bVar10 = true;
      }
      else {
        iVar64 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        bVar10 = -1 < iVar64;
      }
      iVar65 = 6;
      if (bVar10) {
        pVar60 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                           (input,iVar64);
        if (-1 < (long)pVar60) {
          bVar10 = RecurrentParameter::MergePartialFromCodedStream(pRVar59,input);
          goto LAB_00412513;
        }
        goto LAB_00412528;
      }
      break;
    default:
      switch(uVar9) {
      case 1:
        MergePartialFromCodedStream();
        sVar11 = extraout_AX;
        goto LAB_00412772;
      case 2:
        MergePartialFromCodedStream();
        sVar11 = extraout_AX_00;
LAB_00412772:
        if (sVar11 == 0) break;
        iVar65 = 6;
        if (sVar11 == 1) goto LAB_0041252c;
        goto LAB_0041047f;
      case 3:
        if (cVar66 != '\x1a') break;
        pRVar6 = (this->bottom_).super_RepeatedPtrFieldBase.rep_;
        if (pRVar6 == (Rep *)0x0) {
LAB_004125ac:
          google::protobuf::internal::RepeatedPtrFieldBase::Reserve
                    (&this_02->super_RepeatedPtrFieldBase,
                     (this->bottom_).super_RepeatedPtrFieldBase.total_size_ + 1);
LAB_004125bc:
          pRVar6 = (this->bottom_).super_RepeatedPtrFieldBase.rep_;
          pRVar6->allocated_size = pRVar6->allocated_size + 1;
          pAVar8 = (this->bottom_).super_RepeatedPtrFieldBase.arena_;
          if (pAVar8 == (Arena *)0x0) {
            psVar61 = (string *)operator_new(0x20);
            (psVar61->_M_dataplus)._M_p = (pointer)&psVar61->field_2;
            psVar61->_M_string_length = 0;
            (psVar61->field_2)._M_local_buf[0] = '\0';
          }
          else {
            psVar61 = (string *)
                      google::protobuf::Arena::AllocateAligned
                                (pAVar8,(type_info *)&std::__cxx11::string::typeinfo,0x20);
            (psVar61->_M_dataplus)._M_p = (pointer)&psVar61->field_2;
            psVar61->_M_string_length = 0;
            (psVar61->field_2)._M_local_buf[0] = '\0';
            google::protobuf::Arena::AddListNode
                      (pAVar8,psVar61,
                       google::protobuf::internal::arena_destruct_object<std::__cxx11::string>);
          }
          pRVar6 = (this->bottom_).super_RepeatedPtrFieldBase.rep_;
          iVar65 = (this->bottom_).super_RepeatedPtrFieldBase.current_size_;
          (this->bottom_).super_RepeatedPtrFieldBase.current_size_ = iVar65 + 1;
          pRVar6->elements[iVar65] = psVar61;
        }
        else {
          iVar65 = (this->bottom_).super_RepeatedPtrFieldBase.current_size_;
          if (pRVar6->allocated_size <= iVar65) {
            if (pRVar6->allocated_size == (this->bottom_).super_RepeatedPtrFieldBase.total_size_)
            goto LAB_004125ac;
            goto LAB_004125bc;
          }
          (this->bottom_).super_RepeatedPtrFieldBase.current_size_ = iVar65 + 1;
          psVar61 = (string *)pRVar6->elements[iVar65];
        }
        bVar10 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar61);
        if (bVar10) {
          pTVar62 = google::protobuf::internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                              (&this_02->super_RepeatedPtrFieldBase,
                               (this->bottom_).super_RepeatedPtrFieldBase.current_size_ + -1);
          data = (pTVar62->_M_dataplus)._M_p;
          pTVar62 = google::protobuf::internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                              (&this_02->super_RepeatedPtrFieldBase,
                               (this->bottom_).super_RepeatedPtrFieldBase.current_size_ + -1);
          iVar65 = (int)pTVar62->_M_string_length;
          field_name = "caffe.LayerParameter.bottom";
LAB_00412717:
          google::protobuf::internal::WireFormatLite::VerifyUtf8String(data,iVar65,PARSE,field_name)
          ;
          goto LAB_0041047f;
        }
        goto LAB_00412792;
      case 4:
        if (cVar66 == '\"') {
          pRVar6 = (this->top_).super_RepeatedPtrFieldBase.rep_;
          if (pRVar6 == (Rep *)0x0) {
LAB_00412540:
            google::protobuf::internal::RepeatedPtrFieldBase::Reserve
                      (&this_01->super_RepeatedPtrFieldBase,
                       (this->top_).super_RepeatedPtrFieldBase.total_size_ + 1);
LAB_00412550:
            pRVar6 = (this->top_).super_RepeatedPtrFieldBase.rep_;
            pRVar6->allocated_size = pRVar6->allocated_size + 1;
            pAVar8 = (this->top_).super_RepeatedPtrFieldBase.arena_;
            if (pAVar8 == (Arena *)0x0) {
              psVar61 = (string *)operator_new(0x20);
              (psVar61->_M_dataplus)._M_p = (pointer)&psVar61->field_2;
              psVar61->_M_string_length = 0;
              (psVar61->field_2)._M_local_buf[0] = '\0';
            }
            else {
              psVar61 = (string *)
                        google::protobuf::Arena::AllocateAligned
                                  (pAVar8,(type_info *)&std::__cxx11::string::typeinfo,0x20);
              (psVar61->_M_dataplus)._M_p = (pointer)&psVar61->field_2;
              psVar61->_M_string_length = 0;
              (psVar61->field_2)._M_local_buf[0] = '\0';
              google::protobuf::Arena::AddListNode
                        (pAVar8,psVar61,
                         google::protobuf::internal::arena_destruct_object<std::__cxx11::string>);
            }
            pRVar6 = (this->top_).super_RepeatedPtrFieldBase.rep_;
            iVar65 = (this->top_).super_RepeatedPtrFieldBase.current_size_;
            (this->top_).super_RepeatedPtrFieldBase.current_size_ = iVar65 + 1;
            pRVar6->elements[iVar65] = psVar61;
          }
          else {
            iVar65 = (this->top_).super_RepeatedPtrFieldBase.current_size_;
            if (pRVar6->allocated_size <= iVar65) {
              if (pRVar6->allocated_size == (this->top_).super_RepeatedPtrFieldBase.total_size_)
              goto LAB_00412540;
              goto LAB_00412550;
            }
            (this->top_).super_RepeatedPtrFieldBase.current_size_ = iVar65 + 1;
            psVar61 = (string *)pRVar6->elements[iVar65];
          }
          bVar10 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar61);
          if (bVar10) {
            pTVar62 = google::protobuf::internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                                (&this_01->super_RepeatedPtrFieldBase,
                                 (this->top_).super_RepeatedPtrFieldBase.current_size_ + -1);
            data = (pTVar62->_M_dataplus)._M_p;
            pTVar62 = google::protobuf::internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                                (&this_01->super_RepeatedPtrFieldBase,
                                 (this->top_).super_RepeatedPtrFieldBase.current_size_ + -1);
            iVar65 = (int)pTVar62->_M_string_length;
            field_name = "caffe.LayerParameter.top";
            goto LAB_00412717;
          }
          goto LAB_00412792;
        }
        break;
      case 5:
        if (cVar66 == '*') {
          bVar10 = google::protobuf::internal::WireFormatLite::
                   ReadPackedPrimitive<float,(google::protobuf::internal::WireFormatLite::FieldType)2>
                             (input,&this->loss_weight_);
        }
        else {
          if ((uVar67 & 0xff) != 0x2d) break;
          bVar10 = google::protobuf::internal::WireFormatLite::
                   ReadRepeatedPrimitive<float,(google::protobuf::internal::WireFormatLite::FieldType)2>
                             (1,0x2d,input,&this->loss_weight_);
        }
        goto LAB_00410477;
      case 6:
        if (cVar66 == '2') {
          this_04 = google::protobuf::internal::RepeatedPtrFieldBase::
                    Add<google::protobuf::RepeatedPtrField<caffe::ParamSpec>::TypeHandler>
                              (&(this->param_).super_RepeatedPtrFieldBase,(Type *)0x0);
          puVar7 = input->buffer_;
          if ((puVar7 < input->buffer_end_) && (iVar64 = (int)(char)*puVar7, -1 < (char)*puVar7)) {
            input->buffer_ = puVar7 + 1;
            bVar10 = true;
          }
          else {
            iVar64 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
            bVar10 = -1 < iVar64;
          }
          iVar65 = 6;
          if (bVar10) {
            pVar60 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                               (input,iVar64);
            if (-1 < (long)pVar60) {
              bVar10 = ParamSpec::MergePartialFromCodedStream(this_04,input);
              goto LAB_00412513;
            }
            goto LAB_00412528;
          }
          goto LAB_0041252c;
        }
        break;
      case 7:
        if (cVar66 == ':') {
          this_03 = google::protobuf::internal::RepeatedPtrFieldBase::
                    Add<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                              (&(this->blobs_).super_RepeatedPtrFieldBase,(Type *)0x0);
          puVar7 = input->buffer_;
          if ((puVar7 < input->buffer_end_) && (iVar64 = (int)(char)*puVar7, -1 < (char)*puVar7)) {
            input->buffer_ = puVar7 + 1;
            bVar10 = true;
          }
          else {
            iVar64 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
            bVar10 = -1 < iVar64;
          }
          iVar65 = 6;
          if (bVar10) {
            pVar60 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                               (input,iVar64);
            if (-1 < (long)pVar60) {
              bVar10 = BlobProto::MergePartialFromCodedStream(this_03,input);
              goto LAB_00412513;
            }
            goto LAB_00412528;
          }
          goto LAB_0041252c;
        }
        break;
      case 8:
        this_06 = &(this->include_).super_RepeatedPtrFieldBase;
        if (cVar66 == 'B') {
LAB_0041133c:
          this_05 = google::protobuf::internal::RepeatedPtrFieldBase::
                    Add<google::protobuf::RepeatedPtrField<caffe::NetStateRule>::TypeHandler>
                              (this_06,(Type *)0x0);
          puVar7 = input->buffer_;
          if ((puVar7 < input->buffer_end_) && (iVar64 = (int)(char)*puVar7, -1 < (char)*puVar7)) {
            input->buffer_ = puVar7 + 1;
            bVar10 = true;
          }
          else {
            iVar64 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
            bVar10 = -1 < iVar64;
          }
          iVar65 = 6;
          if (bVar10) {
            pVar60 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                               (input,iVar64);
            if (-1 < (long)pVar60) {
              bVar10 = NetStateRule::MergePartialFromCodedStream(this_05,input);
              goto LAB_00412513;
            }
            goto LAB_00412528;
          }
          goto LAB_0041252c;
        }
        break;
      case 9:
        this_06 = &(this->exclude_).super_RepeatedPtrFieldBase;
        if (cVar66 == 'J') goto LAB_0041133c;
        break;
      case 10:
        if (cVar66 == 'P') {
          pbVar4 = input->buffer_;
          if (pbVar4 < input->buffer_end_) {
            bVar3 = *pbVar4;
            uVar68 = (ulong)bVar3;
            uVar12 = (uint32)bVar3;
            if ((char)bVar3 < '\0') goto LAB_004127af;
            input->buffer_ = pbVar4 + 1;
            bVar10 = true;
          }
          else {
            uVar12 = 0;
LAB_004127af:
            uVar68 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar12);
            bVar10 = -1 < (long)uVar68;
          }
          if (bVar10 == false) {
            iVar65 = 6;
          }
          else {
            uVar67 = (uint)uVar68;
            if (uVar67 < 2) {
              pbVar4 = (byte *)((long)(this->_has_bits_).has_bits_ + 6);
              *pbVar4 = *pbVar4 | 2;
              this->phase_ = uVar67;
            }
            else {
              pvVar5 = (this_00->
                       super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       ).ptr_;
              if (((ulong)pvVar5 & 1) == 0) {
                pUVar63 = google::protobuf::internal::
                          InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                          ::mutable_unknown_fields_slow
                                    (&this_00->
                                      super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                                    );
              }
              else {
                pUVar63 = (UnknownFieldSet *)((ulong)pvVar5 & 0xfffffffffffffffe);
              }
              google::protobuf::UnknownFieldSet::AddVarint(pUVar63,10,(long)(int)uVar67);
            }
            iVar65 = 0;
          }
          goto LAB_00412807;
        }
        break;
      case 0xb:
        if (cVar66 == 'Z') {
          bVar10 = google::protobuf::internal::WireFormatLite::
                   ReadPackedPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                             (input,&this->propagate_down_);
        }
        else {
          if ((uVar67 & 0xff) != 0x58) break;
          bVar10 = google::protobuf::internal::WireFormatLite::
                   ReadRepeatedPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                             (1,0x58,input,&this->propagate_down_);
        }
        goto LAB_00410477;
      }
switchD_0041051b_default:
      iVar65 = 7;
      if ((uVar67 & 7) != 4 && uVar67 != 0) {
        pvVar5 = (this_00->
                 super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                 ).ptr_;
        if (((ulong)pvVar5 & 1) == 0) {
          pUVar63 = google::protobuf::internal::
                    InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                    ::mutable_unknown_fields_slow
                              (&this_00->
                                super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                              );
        }
        else {
          pUVar63 = (UnknownFieldSet *)((ulong)pvVar5 & 0xfffffffffffffffe);
        }
        bVar10 = google::protobuf::internal::WireFormat::SkipField(input,uVar67,pUVar63);
LAB_00410477:
        if (bVar10 == false) {
LAB_00412792:
          iVar65 = 6;
        }
        else {
LAB_0041047f:
          iVar65 = 0;
        }
      }
    }
LAB_0041252c:
    if (iVar65 != 0) {
      return iVar65 != 6;
    }
  } while( true );
}

Assistant:

bool LayerParameter::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:caffe.LayerParameter)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional string name = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_name()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->name().data(), this->name().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "caffe.LayerParameter.name");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string type = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_type()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->type().data(), this->type().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "caffe.LayerParameter.type");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated string bottom = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->add_bottom()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->bottom(this->bottom_size() - 1).data(),
            this->bottom(this->bottom_size() - 1).length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "caffe.LayerParameter.bottom");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated string top = 4;
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(34u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->add_top()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->top(this->top_size() - 1).data(),
            this->top(this->top_size() - 1).length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "caffe.LayerParameter.top");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated float loss_weight = 5;
      case 5: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(45u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 1, 45u, input, this->mutable_loss_weight())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(42u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitiveNoInline<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, this->mutable_loss_weight())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .caffe.ParamSpec param = 6;
      case 6: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(50u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .caffe.BlobProto blobs = 7;
      case 7: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(58u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_blobs()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .caffe.NetStateRule include = 8;
      case 8: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(66u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_include()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .caffe.NetStateRule exclude = 9;
      case 9: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(74u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_exclude()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.Phase phase = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(80u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          if (::caffe::Phase_IsValid(value)) {
            set_phase(static_cast< ::caffe::Phase >(value));
          } else {
            mutable_unknown_fields()->AddVarint(10, value);
          }
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated bool propagate_down = 11;
      case 11: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(88u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 1, 88u, input, this->mutable_propagate_down())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(90u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitiveNoInline<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, this->mutable_propagate_down())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.TransformationParameter transform_param = 100;
      case 100: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(802u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_transform_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.LossParameter loss_param = 101;
      case 101: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(810u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_loss_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.AccuracyParameter accuracy_param = 102;
      case 102: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(818u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_accuracy_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.ArgMaxParameter argmax_param = 103;
      case 103: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(826u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_argmax_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.ConcatParameter concat_param = 104;
      case 104: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(834u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_concat_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.ContrastiveLossParameter contrastive_loss_param = 105;
      case 105: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(842u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_contrastive_loss_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.ConvolutionParameter convolution_param = 106;
      case 106: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(850u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_convolution_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.DataParameter data_param = 107;
      case 107: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(858u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_data_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.DropoutParameter dropout_param = 108;
      case 108: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(866u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_dropout_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.DummyDataParameter dummy_data_param = 109;
      case 109: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(874u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_dummy_data_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.EltwiseParameter eltwise_param = 110;
      case 110: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(882u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_eltwise_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.ExpParameter exp_param = 111;
      case 111: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(890u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_exp_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.HDF5DataParameter hdf5_data_param = 112;
      case 112: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(898u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_hdf5_data_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.HDF5OutputParameter hdf5_output_param = 113;
      case 113: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(906u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_hdf5_output_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.HingeLossParameter hinge_loss_param = 114;
      case 114: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(914u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_hinge_loss_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.ImageDataParameter image_data_param = 115;
      case 115: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(922u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_image_data_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.InfogainLossParameter infogain_loss_param = 116;
      case 116: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(930u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_infogain_loss_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.InnerProductParameter inner_product_param = 117;
      case 117: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(938u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_inner_product_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.LRNParameter lrn_param = 118;
      case 118: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(946u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_lrn_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.MemoryDataParameter memory_data_param = 119;
      case 119: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(954u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_memory_data_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.MVNParameter mvn_param = 120;
      case 120: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(962u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_mvn_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.PoolingParameter pooling_param = 121;
      case 121: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(970u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_pooling_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.PowerParameter power_param = 122;
      case 122: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(978u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_power_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.ReLUParameter relu_param = 123;
      case 123: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(986u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_relu_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.SigmoidParameter sigmoid_param = 124;
      case 124: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(994u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_sigmoid_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.SoftmaxParameter softmax_param = 125;
      case 125: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1002u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_softmax_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.SliceParameter slice_param = 126;
      case 126: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1010u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_slice_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.TanHParameter tanh_param = 127;
      case 127: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1018u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_tanh_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.ThresholdParameter threshold_param = 128;
      case 128: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1026u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_threshold_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.WindowDataParameter window_data_param = 129;
      case 129: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1034u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_window_data_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.PythonParameter python_param = 130;
      case 130: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1042u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_python_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.PReLUParameter prelu_param = 131;
      case 131: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1050u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_prelu_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.SPPParameter spp_param = 132;
      case 132: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1058u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_spp_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.ReshapeParameter reshape_param = 133;
      case 133: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1066u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_reshape_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.LogParameter log_param = 134;
      case 134: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1074u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_log_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.FlattenParameter flatten_param = 135;
      case 135: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1082u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_flatten_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.ReductionParameter reduction_param = 136;
      case 136: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1090u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_reduction_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.EmbedParameter embed_param = 137;
      case 137: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1098u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_embed_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.TileParameter tile_param = 138;
      case 138: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1106u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_tile_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.BatchNormParameter batch_norm_param = 139;
      case 139: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1114u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_batch_norm_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.ELUParameter elu_param = 140;
      case 140: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1122u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_elu_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.BiasParameter bias_param = 141;
      case 141: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1130u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_bias_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.ScaleParameter scale_param = 142;
      case 142: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1138u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_scale_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.InputParameter input_param = 143;
      case 143: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1146u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_input_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.CropParameter crop_param = 144;
      case 144: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1154u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_crop_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.ParameterParameter parameter_param = 145;
      case 145: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1162u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_parameter_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.RecurrentParameter recurrent_param = 146;
      case 146: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1170u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_recurrent_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:caffe.LayerParameter)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:caffe.LayerParameter)
  return false;
#undef DO_
}